

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemTools.cxx
# Opt level: O0

void Realpath(string *path,string *resolved_path,string *errorMessage)

{
  int *piVar1;
  char *pcVar2;
  string *in_RDX;
  string *in_RSI;
  string *in_RDI;
  char *ret;
  char resolved_name [4096];
  char local_1018 [4096];
  string *local_18;
  string *local_10;
  string *local_8;
  
  local_18 = in_RDX;
  local_10 = in_RSI;
  local_8 = in_RDI;
  piVar1 = __errno_location();
  *piVar1 = 0;
  pcVar2 = (char *)std::__cxx11::string::c_str();
  pcVar2 = realpath(pcVar2,local_1018);
  if (pcVar2 == (char *)0x0) {
    if (local_18 == (string *)0x0) {
      std::__cxx11::string::operator=(local_10,local_8);
    }
    else {
      piVar1 = __errno_location();
      if (*piVar1 == 0) {
        std::__cxx11::string::operator=(local_18,"Unknown error.");
      }
      else {
        piVar1 = __errno_location();
        pcVar2 = strerror(*piVar1);
        std::__cxx11::string::operator=(local_18,pcVar2);
      }
      std::__cxx11::string::operator=(local_10,"");
    }
  }
  else {
    std::__cxx11::string::operator=(local_10,pcVar2);
  }
  return;
}

Assistant:

inline void Realpath(const std::string& path, std::string& resolved_path,
                     std::string* errorMessage = nullptr)
{
  char resolved_name[KWSYS_SYSTEMTOOLS_MAXPATH];

  errno = 0;
  char* ret = realpath(path.c_str(), resolved_name);
  if (ret) {
    resolved_path = ret;
  } else if (errorMessage) {
    if (errno) {
      *errorMessage = strerror(errno);
    } else {
      *errorMessage = "Unknown error.";
    }

    resolved_path = "";
  } else {
    // if path resolution fails, return what was passed in
    resolved_path = path;
  }
}